

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_CordOutputBufferEndsAtSizeHint_Test::
IoTest_CordOutputBufferEndsAtSizeHint_Test(IoTest_CordOutputBufferEndsAtSizeHint_Test *this)

{
  IoTest_CordOutputBufferEndsAtSizeHint_Test *this_local;
  
  IoTest::IoTest(&this->super_IoTest);
  (this->super_IoTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IoTest_CordOutputBufferEndsAtSizeHint_Test_02a1f5c0;
  return;
}

Assistant:

TEST_F(IoTest, CordOutputBufferEndsAtSizeHint) {
  static const int kSizeHint = 12345;

  CordOutputStream output(kSizeHint);

  void* data;
  int size;
  int total_read = 0;

  while (total_read < kSizeHint) {
    ASSERT_TRUE(output.Next(&data, &size));
    memset(data, 0, static_cast<size_t>(size));  // Avoid uninitialized data UB
    total_read += size;
  }

  EXPECT_EQ(kSizeHint, total_read);

  // We should be able to keep going past the size hint.
  ASSERT_TRUE(output.Next(&data, &size));
  EXPECT_GT(size, 0);

  // Prevent any warnings on unused or unflushed data
  output.Consume();
}